

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void scale_component(opj_image_comp_t *component,OPJ_UINT32 precision)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  OPJ_INT32 *pOVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  
  uVar3 = component->prec;
  if (uVar3 - precision != 0) {
    if (uVar3 < precision) {
      lVar6 = (ulong)component->h * (ulong)component->w;
      if (component->sgnd == 0) {
        pOVar4 = component->data;
        for (lVar7 = 0; lVar6 - lVar7 != 0; lVar7 = lVar7 + 1) {
          pOVar4[lVar7] =
               (OPJ_INT32)
               (((ulong)(uint)pOVar4[lVar7] * (ulong)(uint)~(-1 << ((byte)precision & 0x1f))) /
               (ulong)(uint)~(-1 << ((byte)uVar3 & 0x1f)));
        }
      }
      else {
        pOVar4 = component->data;
        for (lVar7 = 0; lVar6 - lVar7 != 0; lVar7 = lVar7 + 1) {
          pOVar4[lVar7] =
               (OPJ_INT32)
               (((long)pOVar4[lVar7] << ((byte)precision - 1 & 0x3f)) /
               (long)(ulong)(uint)(1 << ((byte)uVar3 - 1 & 0x1f)));
        }
      }
    }
    else {
      lVar6 = (ulong)component->h * (ulong)component->w;
      pOVar4 = component->data;
      bVar5 = (byte)(uVar3 - precision);
      if (component->sgnd == 0) {
        for (lVar7 = 0; lVar6 - lVar7 != 0; lVar7 = lVar7 + 1) {
          puVar2 = (uint *)(pOVar4 + lVar7);
          *puVar2 = *puVar2 >> (bVar5 & 0x1f);
        }
      }
      else {
        for (lVar7 = 0; lVar6 - lVar7 != 0; lVar7 = lVar7 + 1) {
          piVar1 = pOVar4 + lVar7;
          *piVar1 = *piVar1 >> (bVar5 & 0x1f);
        }
      }
    }
    component->prec = precision;
  }
  return;
}

Assistant:

void scale_component(opj_image_comp_t* component, OPJ_UINT32 precision)
{
    int shift;
    OPJ_SIZE_T i, len;

    if (component->prec == precision) {
        return;
    }
    if (component->prec < precision) {
        scale_component_up(component, precision);
        return;
    }
    shift = (int)(component->prec - precision);
    len = (OPJ_SIZE_T)component->w * (OPJ_SIZE_T)component->h;
    if (component->sgnd) {
        OPJ_INT32* l_data = component->data;
        for (i = 0; i < len; ++i) {
            l_data[i] >>= shift;
        }
    } else {
        OPJ_UINT32* l_data = (OPJ_UINT32*)component->data;
        for (i = 0; i < len; ++i) {
            l_data[i] >>= shift;
        }
    }
    component->prec = precision;
}